

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O0

void glu::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *dst,string *src)

{
  string *this;
  value_type local_78;
  value_type local_48;
  long local_28;
  size_t end;
  size_t start;
  string *src_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dst_local;
  
  end = 0;
  local_28 = -1;
  start = (size_t)src;
  src_local = (string *)dst;
  while( true ) {
    local_28 = std::__cxx11::string::find((char)start,0x20);
    this = src_local;
    if (local_28 == -1) break;
    std::__cxx11::string::substr((ulong)&local_48,start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    end = local_28 + 1;
  }
  if (end != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&local_78,start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

static void split (vector<string>& dst, const string& src)
{
	size_t start = 0;
	size_t end	 = string::npos;

	while ((end = src.find(' ', start)) != string::npos)
	{
		dst.push_back(src.substr(start, end-start));
		start = end+1;
	}

	if (start < end)
		dst.push_back(src.substr(start, end-start));
}